

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O1

void __thiscall FMultiPatchTexture::CheckForHacks(FMultiPatchTexture *this)

{
  uint uVar1;
  char *pcVar2;
  TexPart *pTVar3;
  long *plVar4;
  ulong uVar5;
  SWORD *pSVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  uVar1 = this->NumParts;
  if (0 < (int)uVar1) {
    if ((((((gameinfo.gametype == GAME_Heretic) &&
           (pcVar2 = (this->super_FTexture).Name.Chars, *pcVar2 == 'S')) && (pcVar2[1] == 'K')) &&
         ((pcVar2[2] == 'Y' && (pcVar2[4] == '\0')))) && ((byte)(pcVar2[3] - 0x31U) < 3)) &&
       ((this->super_FTexture).Height == 0x80)) {
      (this->super_FTexture).Height = 200;
      (this->super_FTexture).HeightBits = '\b';
    }
    else {
      if (gameinfo.gametype == GAME_Doom) {
        if ((((uVar1 == 1) && ((gameinfo.flags & 1U) == 0)) &&
            (((this->super_FTexture).Height == 0x80 &&
             (((this->Parts->OriginY == -8 &&
               (pcVar2 = (this->super_FTexture).Name.Chars, *pcVar2 == 'S')) && (pcVar2[1] == 'K')))
             ))) && (((pcVar2[2] == 'Y' && (pcVar2[3] == '1')) && (pcVar2[4] == '\0')))) {
          this->Parts->OriginY = 0;
          return;
        }
        if ((((uVar1 == 2) && ((gameinfo.flags & 1U) == 0)) &&
            (((this->super_FTexture).Height == 0x80 &&
             (((pTVar3 = this->Parts, pTVar3->OriginY == -4 && (pTVar3[1].OriginY == -4)) &&
              (pcVar2 = (this->super_FTexture).Name.Chars, *pcVar2 == 'B')))))) &&
           (((pcVar2[1] == 'I' && (pcVar2[2] == 'G')) &&
            ((pcVar2[3] == 'D' &&
             (((pcVar2[4] == 'O' && (pcVar2[5] == 'O')) &&
              ((pcVar2[6] == 'R' && (pcVar2[7] == '7')))))))))) {
          pTVar3->OriginY = 0;
          pTVar3[1].OriginY = 0;
          return;
        }
      }
      if ((this->super_FTexture).Height == 0x100) {
        uVar5 = 1;
        if (1 < (int)uVar1) {
          uVar5 = (ulong)uVar1;
        }
        pSVar6 = &this->Parts->OriginY;
        uVar7 = 0;
        do {
          if (*pSVar6 != 0) {
            uVar5 = uVar7 & 0xffffffff;
            break;
          }
          uVar7 = uVar7 + 1;
          pSVar6 = pSVar6 + 0x14;
        } while (uVar5 != uVar7);
        if (((uint)uVar5 == uVar1) && (0 < this->NumParts)) {
          lVar8 = 0x18;
          lVar9 = 0;
          do {
            plVar4 = *(long **)((long)&this->Parts->OriginX + lVar8);
            (**(code **)(*plVar4 + 0x70))(plVar4,0x100);
            lVar9 = lVar9 + 1;
            lVar8 = lVar8 + 0x28;
          } while (lVar9 < this->NumParts);
        }
      }
    }
  }
  return;
}

Assistant:

void FMultiPatchTexture::CheckForHacks ()
{
	if (NumParts <= 0)
	{
		return;
	}

	// Heretic sky textures are marked as only 128 pixels tall,
	// even though they are really 200 pixels tall.
	if (gameinfo.gametype == GAME_Heretic &&
		Name[0] == 'S' &&
		Name[1] == 'K' &&
		Name[2] == 'Y' &&
		Name[4] == 0 &&
		Name[3] >= '1' &&
		Name[3] <= '3' &&
		Height == 128)
	{
		Height = 200;
		HeightBits = 8;
		return;
	}

	// The Doom E1 sky has its patch's y offset at -8 instead of 0.
	if (gameinfo.gametype == GAME_Doom &&
		!(gameinfo.flags & GI_MAPxx) &&
		NumParts == 1 &&
		Height == 128 &&
		Parts->OriginY == -8 &&
		Name[0] == 'S' &&
		Name[1] == 'K' &&
		Name[2] == 'Y' &&
		Name[3] == '1' &&
		Name[4] == 0)
	{
		Parts->OriginY = 0;
		return;
	}

	// BIGDOOR7 in Doom also has patches at y offset -4 instead of 0.
	if (gameinfo.gametype == GAME_Doom &&
		!(gameinfo.flags & GI_MAPxx) &&
		NumParts == 2 &&
		Height == 128 &&
		Parts[0].OriginY == -4 &&
		Parts[1].OriginY == -4 &&
		Name[0] == 'B' &&
		Name[1] == 'I' &&
		Name[2] == 'G' &&
		Name[3] == 'D' &&
		Name[4] == 'O' &&
		Name[5] == 'O' &&
		Name[6] == 'R' &&
		Name[7] == '7')
	{
		Parts[0].OriginY = 0;
		Parts[1].OriginY = 0;
		return;
	}

	// [RH] Some wads (I forget which!) have single-patch textures 256
	// pixels tall that have patch lengths recorded as 0. I can't think of
	// any good reason for them to do this, and since I didn't make note
	// of which wad made me hack in support for them, the hack is gone
	// because I've added support for DeePsea's true tall patches.
	//
	// Okay, I found a wad with crap patches: Pleiades.wad's sky patches almost
	// fit this description and are a big mess, but they're not single patch!
	if (Height == 256)
	{
		int i;

		// All patches must be at the top of the texture for this fix
		for (i = 0; i < NumParts; ++i)
		{
			if (Parts[i].OriginY != 0)
			{
				break;
			}
		}

		if (i == NumParts)
		{
			for (i = 0; i < NumParts; ++i)
			{
				Parts[i].Texture->HackHack(256);
			}
		}
	}
}